

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_AddTxIn_RemoveTxIn_Test::TestBody(Transaction_AddTxIn_RemoveTxIn_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2d0;
  Message local_2c8 [2];
  CfdException *anon_var_0;
  byte local_221;
  char *pcStack_220;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_210;
  int local_208;
  uint local_204;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_1;
  Message local_1e8;
  AssertHelper local_1e0;
  Message local_1d8;
  TxInReference local_1d0 [144];
  AssertHelper local_140;
  Message local_138;
  int local_130;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar;
  Message local_110;
  allocator local_101;
  string local_100 [32];
  Txid local_e0;
  allocator local_a9;
  string local_a8 [32];
  undefined1 local_88 [8];
  Script script;
  Transaction tx;
  Transaction_AddTxIn_RemoveTxIn_Test *this_local;
  
  cfd::core::Transaction::Transaction
            ((Transaction *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"1600141c673dd706e05b17e5c9ff033c8619d06098d7ac",&local_a9);
  cfd::core::Script::Script((Script *)local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9",
                 &local_101);
      cfd::core::Txid::Txid(&local_e0,local_100);
      cfd::core::Transaction::AddTxIn
                ((Txid *)&script.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(uint)&local_e0,1,
                 (Script *)0xfffffffe);
      cfd::core::Txid::~Txid(&local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
  }
  else {
    testing::Message::Message(&local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10e,
               "Expected: tx.AddTxIn( Txid( \"306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9\"), 1, 4294967294, script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_110);
  }
  local_12c = cfd::core::Transaction::GetTxInCount();
  local_130 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_128,"tx.GetTxInCount()","1",&local_12c,&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x10f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxIn((uint)local_1d0);
      cfd::core::TxInReference::~TxInReference(local_1d0);
    }
  }
  else {
    testing::Message::Message(&local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x110,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::RemoveTxIn((int)&script + 0x30);
    }
  }
  else {
    testing::Message::Message(&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x112,
               "Expected: tx.RemoveTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e8);
  }
  local_204 = cfd::core::Transaction::GetTxInCount();
  local_208 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_200,"tx.GetTxInCount()","0",&local_204,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffde0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffde0);
  if (bVar1) {
    local_221 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Transaction::GetTxIn((uint)&anon_var_0);
      cfd::core::TxInReference::~TxInReference((TxInReference *)&anon_var_0);
    }
    if ((local_221 & 1) != 0) goto LAB_00298adc;
    pcStack_220 = 
    "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2c8);
  testing::internal::AssertHelper::AssertHelper
            (&local_2d0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_transaction.cpp"
             ,0x114,pcStack_220);
  testing::internal::AssertHelper::operator=(&local_2d0,local_2c8);
  testing::internal::AssertHelper::~AssertHelper(&local_2d0);
  testing::Message::~Message(local_2c8);
LAB_00298adc:
  cfd::core::Script::~Script((Script *)local_88);
  cfd::core::Transaction::~Transaction
            ((Transaction *)
             &script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(Transaction, AddTxIn_RemoveTxIn) {
  Transaction tx(exp_version, exp_locktime);

  Script script("1600141c673dd706e05b17e5c9ff033c8619d06098d7ac");
  EXPECT_NO_THROW(
      tx.AddTxIn(
          Txid(
              "306186bd70e56d820508ed3c9fd656ecb4b4ead0b1502fc3349145df5a15b7e9"),
          1, 4294967294, script));
  EXPECT_EQ(tx.GetTxInCount(), 1);
  EXPECT_NO_THROW(tx.GetTxIn(0));

  EXPECT_NO_THROW(tx.RemoveTxIn(0));
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_THROW(tx.GetTxIn(0), CfdException);
}